

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationDecPOMDPDiscrete.cpp
# Opt level: O0

void __thiscall SimulationDecPOMDPDiscrete::Initialize(SimulationDecPOMDPDiscrete *this)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  uint __seed;
  size_t sVar5;
  long lVar6;
  ostream *poVar7;
  void *this_00;
  Simulation *in_RDI;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Index ja;
  Index s;
  double maxAbsReward;
  Index in_stack_ffffffffffffffa8;
  Index in_stack_ffffffffffffffac;
  PlanningUnitDecPOMDPDiscrete *in_stack_ffffffffffffffb0;
  uint local_18;
  uint local_14;
  double local_10;
  
  sVar5 = PlanningUnit::GetHorizon((PlanningUnit *)in_RDI[1]._vptr_Simulation);
  if (sVar5 == 999999) {
    local_10 = 0.0;
    for (local_14 = 0;
        sVar5 = PlanningUnitMADPDiscrete::GetNrStates
                          (&in_stack_ffffffffffffffb0->super_PlanningUnitMADPDiscrete),
        local_14 != sVar5; local_14 = local_14 + 1) {
      for (local_18 = 0;
          sVar5 = PlanningUnitMADPDiscrete::GetNrJointActions((PlanningUnitMADPDiscrete *)0x8f42c1),
          local_18 != sVar5; local_18 = local_18 + 1) {
        iVar4 = (int)in_RDI[1]._vptr_Simulation;
        dVar8 = PlanningUnitDecPOMDPDiscrete::GetReward
                          (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                           in_stack_ffffffffffffffa8);
        std::abs(iVar4);
        if (local_10 < dVar8) {
          iVar4 = (int)in_RDI[1]._vptr_Simulation;
          local_10 = PlanningUnitDecPOMDPDiscrete::GetReward
                               (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                                in_stack_ffffffffffffffa8);
          std::abs(iVar4);
        }
      }
    }
    auVar9._0_8_ = log(1e-06 / local_10);
    dVar8 = PlanningUnitDecPOMDPDiscrete::GetDiscount((PlanningUnitDecPOMDPDiscrete *)0x8f435a);
    dVar8 = log(dVar8);
    auVar9._8_8_ = 0;
    auVar10._0_8_ = auVar9._0_8_ / dVar8;
    auVar10._8_8_ = 0;
    auVar9 = vroundsd_avx(auVar9,auVar10,10);
    lVar6 = lrint(auVar9._0_8_);
    in_RDI[1]._m_nrRuns = (int)lVar6;
    in_RDI[1]._m_random_seed = (int)((ulong)lVar6 >> 0x20);
    poVar7 = std::operator<<((ostream *)&std::cout,"SimulationDecPOMDPDiscrete: Set horizon to ");
    uVar1._0_4_ = in_RDI[1]._m_nrRuns;
    uVar1._4_4_ = in_RDI[1]._m_random_seed;
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar1);
    poVar7 = std::operator<<(poVar7," (g ");
    dVar8 = PlanningUnitDecPOMDPDiscrete::GetDiscount((PlanningUnitDecPOMDPDiscrete *)0x8f43cd);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,dVar8);
    poVar7 = std::operator<<(poVar7," max|R| ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_10);
    poVar7 = std::operator<<(poVar7,")");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  }
  else {
    sVar5 = PlanningUnit::GetHorizon((PlanningUnit *)in_RDI[1]._vptr_Simulation);
    in_RDI[1]._m_nrRuns = (int)sVar5;
    in_RDI[1]._m_random_seed = (int)(sVar5 >> 0x20);
  }
  bVar3 = Simulation::GetVerbose(in_RDI);
  if (bVar3) {
    poVar7 = std::operator<<((ostream *)&std::cout,"Simulation::RunSimulations horizon ");
    uVar2._0_4_ = in_RDI[1]._m_nrRuns;
    uVar2._4_4_ = in_RDI[1]._m_random_seed;
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar2);
    poVar7 = std::operator<<(poVar7," nrRuns ");
    iVar4 = Simulation::GetNrRuns(in_RDI);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar4);
    poVar7 = std::operator<<(poVar7," seed ");
    iVar4 = Simulation::GetRandomSeed(in_RDI);
    this_00 = (void *)std::ostream::operator<<(poVar7,iVar4);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  iVar4 = Simulation::GetRandomSeed(in_RDI);
  if (iVar4 != 0x7fffffff) {
    __seed = Simulation::GetRandomSeed(in_RDI);
    srand(__seed);
  }
  return;
}

Assistant:

void SimulationDecPOMDPDiscrete::Initialize()
{
    if(_m_pu->GetHorizon()==MAXHORIZON)
    {
        // figure out until what horizon we should sample to get a
        // maximum error smaller than 1-e6
        double maxAbsReward=0;
        for(Index s=0;s!=_m_pu->GetNrStates();++s)
            for(Index ja=0;ja!=_m_pu->GetNrJointActions();++ja)
                if(abs(_m_pu->GetReward(s,ja))>maxAbsReward)
                    maxAbsReward=abs(_m_pu->GetReward(s,ja));
        
        _m_horizon=lrint(ceil((log(1e-6/maxAbsReward)/
                               log(_m_pu->GetDiscount()))));

        //if(GetVerbose()) //FAO: I think this is always useful to print...?
            cout << "SimulationDecPOMDPDiscrete: Set horizon to " << _m_horizon << " (g "
                 << _m_pu->GetDiscount() << " max|R| " << maxAbsReward
                 << ")" << endl;
    }
    else
        _m_horizon=_m_pu->GetHorizon();

    if(GetVerbose())
        cout << "Simulation::RunSimulations horizon " << _m_horizon
             << " nrRuns " << GetNrRuns() << " seed " 
             << GetRandomSeed() << endl;
    
    if(GetRandomSeed()!=illegalRandomSeed)
    {
        // Seed the random number generator
        srand(GetRandomSeed());
    }
}